

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

void vm_rewrite_image(CVmFile *origfp,CVmFile *newfp,ulong static_cs_ofs)

{
  int iVar1;
  CVmImageWriter *pCVar2;
  CVmObjTable *pCVar3;
  size_t sVar4;
  unsigned_long uVar5;
  ulong in_RDX;
  CVmFile *in_RSI;
  CVmImageWriter *in_RDI;
  size_t cur;
  int keep_block;
  ulong page_idx;
  uint pool_id_1;
  long start_pos;
  char cppg_buf [20];
  ulong pgsiz;
  ulong pgcnt;
  uint pool_id;
  char cpdf_buf [20];
  ulong siz;
  ulong code_page_size;
  uchar xor_mask;
  CVmConstMapper *const_mapper;
  CVmImageWriter *writer;
  int done;
  char buf [4096];
  long in_stack_ffffffffffffeef8;
  CVmObjTable *in_stack_ffffffffffffef00;
  CVmConstMapper *in_stack_ffffffffffffef08;
  CVmImageWriter *in_stack_ffffffffffffef10;
  CVmImageWriter *in_stack_ffffffffffffef18;
  CVmMetaTable *in_stack_ffffffffffffef30;
  undefined4 in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef3c;
  int iVar6;
  CVmObjTable *in_stack_ffffffffffffef40;
  undefined1 local_10a8 [2];
  undefined1 auStack_10a6 [4];
  undefined1 local_10a2;
  ulong local_1090;
  ulong local_1088;
  int local_107c;
  undefined1 local_1078 [2];
  undefined1 auStack_1076 [4];
  undefined1 auStack_1072 [26];
  CVmMetaTable *local_1058;
  ulong local_1040;
  undefined1 local_1031;
  CVmObjTable *local_1030;
  CVmImageWriter *local_1028;
  int local_101c;
  char local_1018 [4];
  undefined1 auStack_1014 [4092];
  ulong local_18;
  CVmFile *local_10;
  CVmImageWriter *local_8;
  
  local_1040 = 0;
  local_1031 = 0xef;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pCVar2 = (CVmImageWriter *)operator_new(0x70);
  CVmImageWriter::CVmImageWriter(pCVar2,local_10);
  local_1028 = pCVar2;
  pCVar3 = (CVmObjTable *)operator_new(0x48);
  CVmConstMapper::CVmConstMapper((CVmConstMapper *)in_stack_ffffffffffffef10);
  local_1030 = pCVar3;
  CVmUndo::drop_undo((CVmUndo *)in_stack_ffffffffffffef00);
  sVar4 = CVmStack::get_depth(&G_interpreter_X.super_CVmStack);
  CVmStack::discard((int)sVar4);
  CVmObjTable::gc_full(in_stack_ffffffffffffef00);
  CVmObjTable::add_metadeps_for_instances(pCVar3);
  CVmObjTable::rebuild_image_convert_const_data
            (in_stack_ffffffffffffef40,
             (CVmConstMapper *)CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38));
  CVmFile::read_bytes((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                      (size_t)in_stack_ffffffffffffef00);
  CVmFile::write_bytes
            ((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
             (size_t)in_stack_ffffffffffffef00);
  local_101c = 0;
LAB_0022778a:
  do {
    while( true ) {
      while( true ) {
        if (local_101c != 0) {
          if (local_1028 != (CVmImageWriter *)0x0) {
            pCVar2 = local_1028;
            CVmImageWriter::~CVmImageWriter(local_1028);
            operator_delete(pCVar2,0x70);
          }
          if (local_1030 != (CVmObjTable *)0x0) {
            pCVar3 = local_1030;
            CVmConstMapper::~CVmConstMapper((CVmConstMapper *)local_1030);
            operator_delete(pCVar3,0x48);
          }
          return;
        }
        CVmFile::read_bytes((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                            (size_t)in_stack_ffffffffffffef00);
        uVar5 = osrp4(auStack_1014);
        local_1058 = (CVmMetaTable *)(uVar5 & 0xffffffff);
        iVar1 = CVmImageLoader::block_type_is(local_1018,"OBJS");
        if (((iVar1 == 0) && (iVar1 = CVmImageLoader::block_type_is(local_1018,"MCLD"), iVar1 == 0))
           && (iVar1 = CVmImageLoader::block_type_is(local_1018,"SINI"), iVar1 == 0)) break;
        in_stack_ffffffffffffef18 = local_8;
        CVmFile::get_pos((CVmFile *)in_stack_ffffffffffffef00);
        CVmFile::set_pos((CVmFile *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      }
      iVar1 = CVmImageLoader::block_type_is(local_1018,"CPDF");
      if (iVar1 == 0) break;
      CVmFile::read_bytes((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                          (size_t)in_stack_ffffffffffffef00);
      local_107c = osrp2(local_1078);
      uVar5 = osrp4(auStack_1076);
      local_1088 = uVar5 & 0xffffffff;
      uVar5 = osrp4(auStack_1072);
      local_1090 = uVar5 & 0xffffffff;
      if (local_107c == 2) {
        sVar4 = CVmConstMapper::get_page_count((CVmConstMapper *)local_1030);
        local_1088 = sVar4 + local_1088;
        oswp4(auStack_1076,local_1088);
      }
      if ((local_107c == 1) && (local_18 != 0)) {
        local_1088 = local_18 / local_1090;
        oswp4(auStack_1076,local_1088);
        local_1040 = local_1090;
      }
      CVmFile::write_bytes
                ((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                 (size_t)in_stack_ffffffffffffef00);
      CVmFile::write_bytes
                ((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                 (size_t)in_stack_ffffffffffffef00);
    }
    iVar1 = CVmImageLoader::block_type_is(local_1018,"CPPG");
    if (iVar1 == 0) {
      iVar1 = CVmImageLoader::block_type_is(local_1018,"EOF ");
      if (iVar1 != 0) {
        local_101c = 1;
        CVmMetaTable::rebuild_image(in_stack_ffffffffffffef30,pCVar2);
        vm_rewrite_objs_blocks(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
        CVmConstMapper::write_to_image_file
                  ((CVmConstMapper *)pCVar3,in_stack_ffffffffffffef18,
                   (uchar)((ulong)in_stack_ffffffffffffef10 >> 0x38));
      }
    }
    else {
      iVar6 = 1;
      CVmFile::get_pos((CVmFile *)in_stack_ffffffffffffef00);
      CVmFile::read_bytes((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                          (size_t)in_stack_ffffffffffffef00);
      CVmFile::set_pos((CVmFile *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      iVar1 = osrp2(local_10a8);
      uVar5 = osrp4(auStack_10a6);
      if (iVar1 == 2) {
        local_1031 = local_10a2;
      }
      if (((iVar1 == 1) && (local_18 != 0)) && (local_18 <= (uVar5 & 0xffffffff) * local_1040)) {
        iVar6 = 0;
      }
      if (iVar6 == 0) {
        in_stack_ffffffffffffef10 = local_8;
        CVmFile::get_pos((CVmFile *)in_stack_ffffffffffffef00);
        CVmFile::set_pos((CVmFile *)in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
        goto LAB_0022778a;
      }
    }
    CVmFile::write_bytes
              ((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
               (size_t)in_stack_ffffffffffffef00);
    for (; local_1058 != (CVmMetaTable *)0x0;
        local_1058 = (CVmMetaTable *)((long)local_1058 - (long)in_stack_ffffffffffffef30)) {
      in_stack_ffffffffffffef30 = (CVmMetaTable *)0x1000;
      if (local_1058 < (CVmMetaTable *)0x1000) {
        in_stack_ffffffffffffef30 = local_1058;
      }
      CVmFile::read_bytes((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                          (size_t)in_stack_ffffffffffffef00);
      CVmFile::write_bytes
                ((CVmFile *)in_stack_ffffffffffffef10,(char *)in_stack_ffffffffffffef08,
                 (size_t)in_stack_ffffffffffffef00);
    }
  } while( true );
}

Assistant:

void vm_rewrite_image(VMG_ CVmFile *origfp, CVmFile *newfp,
                      ulong static_cs_ofs)
{
    char buf[4096];
    int done;
    CVmImageWriter *writer;
    CVmConstMapper *const_mapper;
    uchar xor_mask;
    ulong code_page_size;

    /* we don't know the code page size yet */
    code_page_size = 0;

    /* choose an arbitrary XOR mask for our pages */
    xor_mask = 0xEF;

    /* create an image writer to help us write the output file */
    writer = new CVmImageWriter(newfp);

    /* create our constant mapper */
    const_mapper = new CVmConstMapper(vmg0_);

    /* 
     *   clear all undo information - we don't save undo with the rebuilt
     *   file, so there's no reason to keep any of the objects that are
     *   referenced only in the undo records 
     */
    G_undo->drop_undo(vmg0_);

    /* discard everything on the stack */
    G_stk->discard(G_stk->get_depth());

    /* 
     *   perform a full garbage collection pass, to make sure we don't
     *   include any unreachable objects in the new image file 
     */
    G_obj_table->gc_full(vmg0_);

    /* add any metaclasses that weren't in the dependency table originally */
    G_obj_table->add_metadeps_for_instances(vmg0_);

    /* convert objects to constant data to the extent possible */
    G_obj_table->rebuild_image_convert_const_data(vmg_ const_mapper);

    /* 
     *   copy the header (signature, UINT2 format version number, 32
     *   reserved bytes, 24-byte compilation timestamp) to the new file 
     */
    origfp->read_bytes(buf, sizeof(VMIMAGE_SIG) - 1 + 2 + 32 + 24);
    newfp->write_bytes(buf, sizeof(VMIMAGE_SIG) - 1 + 2 + 32 + 24);

    /* copy or replace the data blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;

        /* read the next block header */
        origfp->read_bytes(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* check the block type */
        if (CVmImageLoader::block_type_is(buf, "OBJS")
            || CVmImageLoader::block_type_is(buf, "MCLD")
            || CVmImageLoader::block_type_is(buf, "SINI"))
        {
            /* 
             *   Simply skip all of the original OBJS (object data) or
             *   MCLD (metaclass dependency table) blocks -- we'll replace
             *   them with our re-built blocks.
             *   
             *   Also skip SINI (static initializer) blocks, since these
             *   are only needed for pre-initialization and can be
             *   discarded from the final image file.  
             */
            origfp->set_pos(origfp->get_pos() + (long)siz);
        }
        else if (CVmImageLoader::block_type_is(buf, "CPDF"))
        {
            char cpdf_buf[20];
            uint pool_id;
            ulong pgcnt;
            ulong pgsiz;
            
            /* read the pool definition */
            origfp->read_bytes(cpdf_buf, 10);

            /* get the ID, page count, and page size from the definition */
            pool_id = osrp2(cpdf_buf);
            pgcnt = t3rp4u(cpdf_buf + 2);
            pgsiz = t3rp4u(cpdf_buf + 6);

            /* 
             *   if this is the constant pool (pool ID = 2), increase the
             *   page count by the extra constant pool pages we need for
             *   converting new object data to constants 
             */
            if (pool_id == 2)
            {
                /* add in our new count */
                pgcnt += const_mapper->get_page_count();

                /* write the new count */
                oswp4(cpdf_buf + 2, pgcnt);
            }

            /*
             *   if this is the code pool (pool ID = 1), and we have
             *   static initializers, decrease the page count to exclude
             *   the static initializer pages (all of the static
             *   initializers are grouped at the high end of the code
             *   pool, so we can discard them and only them by truncating
             *   the code pool before the page containing the first static
             *   initializer) 
             */
            if (pool_id == 1 && static_cs_ofs != 0)
            {
                /* 
                 *   calculate the new count - it's the offset to the
                 *   first static initializer divided by the size of each
                 *   code page 
                 */
                pgcnt = static_cs_ofs / pgsiz;
                
                /* write the new count */
                oswp4(cpdf_buf + 2, pgcnt);

                /* 
                 *   remember the code page size for later, when we're
                 *   scanning the code pages themselves 
                 */
                code_page_size = pgsiz;
            }
            
            /* update the constant block definition */
            newfp->write_bytes(buf, 10);
            newfp->write_bytes(cpdf_buf, 10);
        }
        else if (CVmImageLoader::block_type_is(buf, "CPPG"))
        {
            char cppg_buf[20];
            long start_pos;
            uint pool_id;
            ulong page_idx;
            int keep_block;

            /* presume we're going to keep this block */
            keep_block = TRUE;
            
            /* 
             *   This is a constant page - if it's in pool 2 (constants),
             *   use its XOR mask for any new pages we write.  First, read
             *   the pool header, then seek back so we can copy the block
             *   unchanged.  
             */
            start_pos = origfp->get_pos();
            origfp->read_bytes(cppg_buf, 7);
            origfp->set_pos(start_pos);

            /* get the pool ID and the page's index */
            pool_id = osrp2(cppg_buf);
            page_idx = t3rp4u(cppg_buf + 2);

            /* if it's pool 2 (constants), read its XOR mask byte */
            if (pool_id == 2)
                xor_mask = cppg_buf[6];

            /* 
             *   if it's pool 1 (code), and it's above the start of the
             *   static initializers, skip it - we don't want to copy
             *   static initializer code to the final image file, since
             *   they're only needed for static initialization, which we
             *   necessarily have finished by the time we reach this point 
             */
            if (pool_id == 1
                && static_cs_ofs != 0
                && page_idx * code_page_size >= static_cs_ofs)
            {
                /* this is a static initializer block - skip it */
                keep_block = FALSE;
            }

            /* keep or skip the block, as appropriate */
            if (keep_block)
            {
                /* 
                 *   we only wanted to get information from this block, so
                 *   go copy it as-is to the output 
                 */
                goto copy_block;
            }
            else
            {
                /* skip past the block */
                origfp->set_pos(origfp->get_pos() + (long)siz);
            }
        }
        else if (CVmImageLoader::block_type_is(buf, "EOF "))
        {
            /* end of file - note that we're done after this block */
            done = TRUE;

            /* re-write the metaclass dependency block */
            G_meta_table->rebuild_image(writer);

            /* write our new OBJS blocks */
            vm_rewrite_objs_blocks(vmg_ writer, const_mapper);

            /* write our new constant pool pages */
            const_mapper->write_to_image_file(writer, xor_mask);

            /* copy the EOF block to the new file unchanged */
            goto copy_block;
        }
        else
        {
        copy_block:
            /*
             *   For anything else, we'll simply copy the original block
             *   from the original image file unchanged. 
             */
            
            /* write the block header unchanged */
            newfp->write_bytes(buf, 10);

            /* copy the block in chunks */
            while (siz != 0)
            {
                size_t cur;

                /* 
                 *   read as much as we can, up to the amount remaining or
                 *   the buffer size, whichever is smaller 
                 */
                cur = sizeof(buf);
                if (cur > siz)
                    cur = (size_t)siz;

                /* read the data and write it out */
                origfp->read_bytes(buf, cur);
                newfp->write_bytes(buf, cur);

                /* deduct this chunk from the amount remaining */
                siz -= cur;
            }
        }
    }

    /* we're done with the image writer */
    delete writer;

    /* we're done with the constant mapper */
    delete const_mapper;
}